

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

void __thiscall cppcms::rpc::json_rpc_server::smd(json_rpc_server *this,value *v)

{
  value *in_RDI;
  ostringstream ss;
  ostringstream *this_00;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  this_00 = local_188;
  std::__cxx11::ostringstream::ostringstream(this_00);
  json::operator<<((ostream *)this_00,in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd),local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void json_rpc_server::smd(json::value const &v)
	{
		std::ostringstream ss;
		ss<<v;
		smd_=ss.str();
	}